

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSPI.cpp
# Opt level: O2

Name __thiscall
wasm::JSPI::makeWrapperForExport(JSPI *this,Function *func,Module *module,Name suspender)

{
  pointer *this_00;
  ExpressionList *this_01;
  MixedArena *this_02;
  uintptr_t uVar1;
  string_view sVar2;
  pointer puVar3;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar4;
  Module *this_03;
  undefined1 auVar5 [8];
  pointer pTVar6;
  Call *item;
  Type *__x;
  LocalGet *pLVar7;
  Block *this_04;
  GlobalSet *item_00;
  Const *item_01;
  Function *pFVar8;
  char *pcVar9;
  Type TVar10;
  Type *__x_00;
  Index index;
  Name name;
  Name root;
  Name root_00;
  Signature SVar11;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar12;
  Name name_00;
  IString local_158;
  Name local_148;
  HeapType local_138;
  Type local_130;
  size_t local_128;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *local_120;
  Module *local_118;
  Type *local_110;
  char *local_108;
  char *local_100;
  string_view local_f8;
  undefined1 auStack_e8 [8];
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> namedWrapperParams;
  _Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_> local_c8;
  undefined1 auStack_a8 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> wrapperParams;
  undefined1 local_68 [8];
  Iterator __begin2;
  Builder local_48;
  Builder builder;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_38;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> wrapperFunc;
  
  pcVar9 = suspender.super_IString.str._M_len;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_e8,"export$",(allocator<char> *)&local_c8);
  builder.wasm = (Module *)func;
  IString::toString_abi_cxx11_((string *)local_68,(IString *)func);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  local_108 = suspender.super_IString.str._M_str;
  local_100 = suspender.super_IString.str._M_len;
  IString::IString(&local_158,(string *)auStack_a8);
  root.super_IString.str._M_str = pcVar9;
  root.super_IString.str._M_len = (size_t)local_158.str._M_str;
  local_f8 = (string_view)
             Names::getValidFunctionName((Names *)module,(Module *)local_158.str._M_len,root);
  std::__cxx11::string::~string((string *)auStack_a8);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)auStack_e8);
  this_02 = &module->allocator;
  local_48.wasm = module;
  item = MixedArena::alloc<wasm::Call>(this_02);
  puVar3 = ((builder.wasm)->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (item->target).super_IString.str._M_len =
       (size_t)((builder.wasm)->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  (item->target).super_IString.str._M_str = (char *)puVar3;
  this_00 = &((builder.wasm)->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  SVar11 = HeapType::getSignature((HeapType *)this_00);
  (item->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id =
       SVar11.results.id.id;
  auStack_a8 = (undefined1  [8])0x0;
  wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_e8 = (undefined1  [8])0x0;
  namedWrapperParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  namedWrapperParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __x_00 = &this->externref;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_a8,__x_00);
  Name::Name(&local_148,"susp");
  root_00.super_IString.str._M_str = pcVar9;
  root_00.super_IString.str._M_len = (size_t)local_148.super_IString.str._M_str;
  _local_68 = (string_view)
              Names::getValidLocalName
                        ((Names *)builder.wasm,(Function *)local_148.super_IString.str._M_len,
                         root_00);
  std::vector<wasm::NameType,std::allocator<wasm::NameType>>::emplace_back<wasm::Name,wasm::Type&>
            ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)auStack_e8,(Name *)local_68,
             __x_00);
  SVar11 = HeapType::getSignature((HeapType *)this_00);
  local_38._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       SVar11.params.id;
  local_68 = (undefined1  [8])&local_38;
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  PVar12 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
           wasm::Type::end((Type *)local_68);
  local_120 = &(item->operands).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
  index = 0;
  local_118 = module;
  while( true ) {
    this_03 = local_118;
    PVar4.index = (size_t)__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
    ;
    PVar4.parent = (Type *)local_68;
    local_128 = PVar12.index;
    local_110 = PVar12.parent;
    if (PVar12 == PVar4) break;
    __x = wasm::Type::Iterator::operator*((Iterator *)local_68);
    pTVar6 = wrapperParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    auVar5 = auStack_a8;
    uVar1 = __x->id;
    pLVar7 = MixedArena::alloc<wasm::LocalGet>(this_02);
    pLVar7->index = (Index)((ulong)((long)pTVar6 - (long)auVar5) >> 3);
    (pLVar7->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar1;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (local_120,(Expression *)pLVar7);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_a8,__x);
    local_c8._M_impl.super__Vector_impl_data._0_16_ =
         Function::getLocalNameOrGeneric((Function *)builder.wasm,index);
    std::vector<wasm::NameType,std::allocator<wasm::NameType>>::
    emplace_back<wasm::Name,wasm::Type_const&>
              ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)auStack_e8,(Name *)&local_c8
               ,__x);
    PVar12.index = local_128;
    PVar12.parent = local_110;
    index = index + 1;
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)((long)&(__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                         )->id + 1);
  }
  this_04 = MixedArena::alloc<wasm::Block>(this_02);
  uVar1 = __x_00->id;
  pLVar7 = MixedArena::alloc<wasm::LocalGet>(&(local_48.wasm)->allocator);
  pLVar7->index = 0;
  (pLVar7->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar1;
  name.super_IString.str._M_str = local_108;
  name.super_IString.str._M_len = (size_t)local_100;
  item_00 = Builder::makeGlobalSet(&local_48,name,(Expression *)pLVar7);
  this_01 = &this_04->list;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&this_01->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)item_00);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&this_01->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)item);
  SVar11 = HeapType::getSignature((HeapType *)this_00);
  TVar10 = SVar11.results.id;
  if (TVar10.id == 0) {
    item_01 = Builder::makeConst<int>(&local_48,0);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_01->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)item_01);
    TVar10.id = 2;
  }
  Block::finalize(this_04);
  Tuple::Tuple((Tuple *)local_68,(TypeList *)auStack_a8);
  wasm::Type::Type(&local_130,(Tuple *)local_68);
  SVar11.results.id = TVar10.id;
  SVar11.params.id = local_130.id;
  HeapType::HeapType(&local_138,SVar11);
  local_c8._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  name_00.super_IString.str._M_str = (char *)local_f8._M_len;
  name_00.super_IString.str._M_len = (size_t)&local_38;
  Builder::makeFunction
            (name_00,(vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_f8._M_str,
             (HeapType)auStack_e8,
             (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_138.id,
             (Expression *)&local_c8);
  std::_Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>::~_Vector_base(&local_c8);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
            ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)local_68);
  pFVar8 = Module::addFunction(this_03,&local_38);
  sVar2 = (pFVar8->super_Importable).super_Named.name.super_IString.str;
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_38);
  std::_Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>::~_Vector_base
            ((_Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_> *)auStack_e8);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
            ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_a8);
  return (IString)(IString)sVar2;
}

Assistant:

Name makeWrapperForExport(Function* func, Module* module, Name suspender) {
    Name wrapperName = Names::getValidFunctionName(
      *module, std::string("export$") + func->name.toString());

    Builder builder(*module);

    auto* call = module->allocator.alloc<Call>();
    call->target = func->name;
    call->type = func->getResults();

    // Add an externref param as the first argument and copy all the original
    // params to new export.
    std::vector<Type> wrapperParams;
    std::vector<NameType> namedWrapperParams;
    wrapperParams.push_back(externref);
    namedWrapperParams.emplace_back(Names::getValidLocalName(*func, "susp"),
                                    externref);
    Index i = 0;
    for (const auto& param : func->getParams()) {
      call->operands.push_back(
        builder.makeLocalGet(wrapperParams.size(), param));
      wrapperParams.push_back(param);
      namedWrapperParams.emplace_back(func->getLocalNameOrGeneric(i), param);
      i++;
    }
    auto* block = builder.makeBlock();
    block->list.push_back(
      builder.makeGlobalSet(suspender, builder.makeLocalGet(0, externref)));
    block->list.push_back(call);
    Type resultsType = func->getResults();
    if (resultsType == Type::none) {
      // A void return is not currently allowed by v8. Add an i32 return value
      // that is ignored.
      // https://bugs.chromium.org/p/v8/issues/detail?id=13231
      resultsType = Type::i32;
      block->list.push_back(builder.makeConst(0));
    }
    block->finalize();
    auto wrapperFunc =
      Builder::makeFunction(wrapperName,
                            std::move(namedWrapperParams),
                            Signature(Type(wrapperParams), resultsType),
                            {},
                            block);
    return module->addFunction(std::move(wrapperFunc))->name;
  }